

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euler.c
# Opt level: O0

void glmc_euler_yzx_quat(float *angles,float *dest)

{
  float *in_RSI;
  float *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float zs;
  float ys;
  float xs;
  float zc;
  float yc;
  float xc;
  
  fVar1 = sinf(*in_RDI * 0.5);
  fVar2 = cosf(*in_RDI * 0.5);
  fVar3 = sinf(in_RDI[1] * 0.5);
  fVar4 = cosf(in_RDI[1] * 0.5);
  fVar5 = sinf(in_RDI[2] * 0.5);
  fVar6 = cosf(in_RDI[2] * 0.5);
  *in_RSI = fVar4 * fVar6 * fVar1 + fVar3 * fVar5 * fVar2;
  in_RSI[1] = fVar4 * fVar5 * fVar1 + fVar3 * fVar6 * fVar2;
  in_RSI[2] = fVar4 * fVar5 * fVar2 + -(fVar3 * fVar6 * fVar1);
  in_RSI[3] = fVar4 * fVar6 * fVar2 + -(fVar3 * fVar5 * fVar1);
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_euler_yzx_quat(vec3 angles, versor dest) {
  glm_euler_yzx_quat(angles, dest);
}